

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_csv.cpp
# Opt level: O2

vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
* duckdb::CreateCastExpressions
            (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             *__return_storage_ptr__,WriteCSVData *bind_data,ClientContext *context,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            *names,vector<duckdb::LogicalType,_true> *sql_types)

{
  LogicalTypeId LVar1;
  pointer puVar2;
  mapped_type *pmVar3;
  Binder *pBVar4;
  Binder *this;
  idx_t index;
  const_reference args_1;
  const_reference args;
  type binder_00;
  pointer *__ptr;
  map<duckdb::LogicalTypeId,_duckdb::Value,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>_>_>
  *this_00;
  optional_ptr<duckdb::LogicalType,_true> result_type;
  bool bVar5;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_118;
  ParsedExpression *local_110;
  char local_102;
  char local_101;
  duckdb local_100;
  undefined7 uStack_ff;
  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
  *local_f8;
  undefined1 local_f0 [24];
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  unbound_expressions;
  shared_ptr<duckdb::Binder,_true> binder;
  ExpressionBinder expression_binder;
  
  this_00 = &(bind_data->super_BaseCSVData).options.write_date_format;
  expression_binder._vptr_ExpressionBinder =
       (_func_int **)CONCAT71(expression_binder._vptr_ExpressionBinder._1_7_,0xf);
  local_f8 = (vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
              *)__return_storage_ptr__;
  pmVar3 = ::std::
           map<duckdb::LogicalTypeId,_duckdb::Value,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>_>_>
           ::operator[](this_00,(key_type *)&expression_binder);
  local_102 = pmVar3->is_null;
  expression_binder._vptr_ExpressionBinder =
       (_func_int **)CONCAT71(expression_binder._vptr_ExpressionBinder._1_7_,0x13);
  pmVar3 = ::std::
           map<duckdb::LogicalTypeId,_duckdb::Value,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>_>_>
           ::operator[](this_00,(key_type *)&expression_binder);
  local_101 = pmVar3->is_null;
  Binder::CreateBinder
            ((Binder *)&binder,context,(optional_ptr<duckdb::Binder,_true>)0x0,REGULAR_BINDER);
  pBVar4 = shared_ptr<duckdb::Binder,_true>::operator->(&binder);
  this = shared_ptr<duckdb::Binder,_true>::operator->(&binder);
  index = Binder::GenerateTableIndex(this);
  ::std::__cxx11::string::string
            ((string *)&expression_binder,"copy_csv",(allocator *)&unbound_expressions);
  BindContext::AddGenericBinding
            (&pBVar4->bind_context,index,(string *)&expression_binder,names,sql_types);
  ::std::__cxx11::string::~string((string *)&expression_binder);
  unbound_expressions.
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unbound_expressions.
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unbound_expressions.
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f0._0_8_ = (_func_int **)0x0;
  do {
    if ((_func_int **)
        (((long)(sql_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
                .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_finish -
         (long)(sql_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start) / 0x18) <= (ulong)local_f0._0_8_) {
      *(undefined8 *)local_f8 = 0;
      *(pointer *)(local_f8 + 8) = (pointer)0x0;
      *(pointer *)(local_f8 + 0x10) = (pointer)0x0;
      binder_00 = shared_ptr<duckdb::Binder,_true>::operator*(&binder);
      ExpressionBinder::ExpressionBinder(&expression_binder,binder_00,context,false);
      LogicalType::LogicalType((LogicalType *)local_f0,VARCHAR);
      LogicalType::operator=(&expression_binder.target_type,(LogicalType *)local_f0);
      LogicalType::~LogicalType((LogicalType *)local_f0);
      puVar2 = unbound_expressions.
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (result_type.ptr =
                (LogicalType *)
                unbound_expressions.
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start; result_type.ptr != (LogicalType *)puVar2;
          result_type.ptr = (LogicalType *)&(result_type.ptr)->type_info_) {
        ExpressionBinder::Bind
                  ((ExpressionBinder *)local_f0,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&expression_binder,result_type,false);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  (local_f8,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                             *)local_f0);
        if ((_func_int **)local_f0._0_8_ != (_func_int **)0x0) {
          (**(code **)(*(_func_int **)local_f0._0_8_ + 8))();
        }
      }
      ExpressionBinder::~ExpressionBinder(&expression_binder);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::~vector(&unbound_expressions.
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               );
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      return (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *)local_f8;
    }
    args_1 = vector<duckdb::LogicalType,_true>::get<true>(sql_types,local_f0._0_8_);
    args = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ::get<true>(names,local_f0._0_8_);
    LVar1 = args_1->id_;
    bVar5 = true;
    if (((LVar1 == TIMESTAMP) || (bVar5 = LVar1 == TIMESTAMP_TZ, LVar1 != DATE)) ||
       (local_102 != '\0')) {
      if ((local_101 == '\0') && (bVar5)) {
        expression_binder._vptr_ExpressionBinder = (_func_int **)0x0;
        expression_binder.target_type.id_ = INVALID;
        expression_binder.target_type.physical_type_ = ~INVALID;
        expression_binder.target_type._2_6_ = 0;
        expression_binder.target_type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        make_uniq<duckdb::BoundReferenceExpression,std::__cxx11::string_const&,duckdb::LogicalType_const&,unsigned_long&>
                  (&local_100,args,args_1,(unsigned_long *)local_f0);
        make_uniq<duckdb::BoundExpression,duckdb::unique_ptr<duckdb::BoundReferenceExpression,std::default_delete<duckdb::BoundReferenceExpression>,true>>
                  ((duckdb *)&local_110,
                   (unique_ptr<duckdb::BoundReferenceExpression,_std::default_delete<duckdb::BoundReferenceExpression>,_true>
                    *)&local_100);
        local_118._M_head_impl = local_110;
        local_110 = (ParsedExpression *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&expression_binder,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_118);
        if (local_118._M_head_impl != (ParsedExpression *)0x0) {
          (*((local_118._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_118._M_head_impl = (ParsedExpression *)0x0;
        if (local_110 != (ParsedExpression *)0x0) {
          (**(code **)(*(long *)local_110 + 8))();
        }
        local_110 = (ParsedExpression *)0x0;
        if ((long *)CONCAT71(uStack_ff,local_100) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(uStack_ff,local_100) + 8))();
        }
        local_100 = (duckdb)0x13;
        pmVar3 = ::std::
                 map<duckdb::LogicalTypeId,_duckdb::Value,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>_>_>
                 ::operator[](this_00,(key_type *)&local_100);
        make_uniq<duckdb::ConstantExpression,duckdb::Value&>((duckdb *)&local_110,pmVar3);
        local_118._M_head_impl = local_110;
        local_110 = (ParsedExpression *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&expression_binder,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_118);
        if (local_118._M_head_impl != (ParsedExpression *)0x0) {
          (*((local_118._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_118._M_head_impl = (ParsedExpression *)0x0;
        if (local_110 != (ParsedExpression *)0x0) {
          (*(local_110->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        make_uniq_base<duckdb::ParsedExpression,duckdb::FunctionExpression,char_const(&)[9],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
                  ((duckdb *)&local_118,(char (*) [9])0x1051a8b,
                   (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    *)&expression_binder);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&unbound_expressions,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_118);
        goto LAB_00888c49;
      }
      make_uniq<duckdb::BoundReferenceExpression,std::__cxx11::string_const&,duckdb::LogicalType_const&,unsigned_long&>
                ((duckdb *)&local_118,args,args_1,(unsigned_long *)local_f0);
      make_uniq<duckdb::BoundExpression,duckdb::unique_ptr<duckdb::BoundReferenceExpression,std::default_delete<duckdb::BoundReferenceExpression>,true>>
                ((duckdb *)&expression_binder,
                 (unique_ptr<duckdb::BoundReferenceExpression,_std::default_delete<duckdb::BoundReferenceExpression>,_true>
                  *)&local_118);
      if (local_118._M_head_impl != (ParsedExpression *)0x0) {
        (*((local_118._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      make_uniq_base<duckdb::ParsedExpression,duckdb::CastExpression,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::BoundExpression,std::default_delete<duckdb::BoundExpression>,true>>
                ((duckdb *)&local_118,&LogicalType::VARCHAR,
                 (unique_ptr<duckdb::BoundExpression,_std::default_delete<duckdb::BoundExpression>,_true>
                  *)&expression_binder);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&unbound_expressions,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_118);
      if (local_118._M_head_impl != (ParsedExpression *)0x0) {
        (*((local_118._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      if (expression_binder._vptr_ExpressionBinder != (_func_int **)0x0) {
        (**(code **)(*expression_binder._vptr_ExpressionBinder + 8))();
      }
    }
    else {
      expression_binder._vptr_ExpressionBinder = (_func_int **)0x0;
      expression_binder.target_type.id_ = INVALID;
      expression_binder.target_type.physical_type_ = ~INVALID;
      expression_binder.target_type._2_6_ = 0;
      expression_binder.target_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      make_uniq<duckdb::BoundReferenceExpression,std::__cxx11::string_const&,duckdb::LogicalType_const&,unsigned_long&>
                (&local_100,args,args_1,(unsigned_long *)local_f0);
      make_uniq<duckdb::BoundExpression,duckdb::unique_ptr<duckdb::BoundReferenceExpression,std::default_delete<duckdb::BoundReferenceExpression>,true>>
                ((duckdb *)&local_110,
                 (unique_ptr<duckdb::BoundReferenceExpression,_std::default_delete<duckdb::BoundReferenceExpression>,_true>
                  *)&local_100);
      local_118._M_head_impl = local_110;
      local_110 = (ParsedExpression *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&expression_binder,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_118);
      if (local_118._M_head_impl != (ParsedExpression *)0x0) {
        (*((local_118._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_118._M_head_impl = (ParsedExpression *)0x0;
      if (local_110 != (ParsedExpression *)0x0) {
        (**(code **)(*(long *)local_110 + 8))();
      }
      local_110 = (ParsedExpression *)0x0;
      if ((long *)CONCAT71(uStack_ff,local_100) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(uStack_ff,local_100) + 8))();
      }
      local_100 = (duckdb)0xf;
      pmVar3 = ::std::
               map<duckdb::LogicalTypeId,_duckdb::Value,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>_>_>
               ::operator[](this_00,(key_type *)&local_100);
      make_uniq<duckdb::ConstantExpression,duckdb::Value&>((duckdb *)&local_110,pmVar3);
      local_118._M_head_impl = local_110;
      local_110 = (ParsedExpression *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&expression_binder,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_118);
      if (local_118._M_head_impl != (ParsedExpression *)0x0) {
        (*((local_118._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_118._M_head_impl = (ParsedExpression *)0x0;
      if (local_110 != (ParsedExpression *)0x0) {
        (*(local_110->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      make_uniq_base<duckdb::ParsedExpression,duckdb::FunctionExpression,char_const(&)[9],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
                ((duckdb *)&local_118,(char (*) [9])0x1051a8b,
                 (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  *)&expression_binder);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&unbound_expressions,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_118);
LAB_00888c49:
      if (local_118._M_head_impl != (ParsedExpression *)0x0) {
        (*((local_118._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 *)&expression_binder);
    }
    local_f0._0_8_ = local_f0._0_8_ + 1;
  } while( true );
}

Assistant:

static vector<unique_ptr<Expression>> CreateCastExpressions(WriteCSVData &bind_data, ClientContext &context,
                                                            const vector<string> &names,
                                                            const vector<LogicalType> &sql_types) {
	auto &options = bind_data.options;
	auto &formats = options.write_date_format;

	bool has_dateformat = !formats[LogicalTypeId::DATE].IsNull();
	bool has_timestampformat = !formats[LogicalTypeId::TIMESTAMP].IsNull();

	// Create a binder
	auto binder = Binder::CreateBinder(context);

	auto &bind_context = binder->bind_context;
	auto table_index = binder->GenerateTableIndex();
	bind_context.AddGenericBinding(table_index, "copy_csv", names, sql_types);

	// Create the ParsedExpressions (cast, strftime, etc..)
	vector<unique_ptr<ParsedExpression>> unbound_expressions;
	for (idx_t i = 0; i < sql_types.size(); i++) {
		auto &type = sql_types[i];
		auto &name = names[i];

		bool is_timestamp = type.id() == LogicalTypeId::TIMESTAMP || type.id() == LogicalTypeId::TIMESTAMP_TZ;
		if (has_dateformat && type.id() == LogicalTypeId::DATE) {
			// strftime(<name>, 'format')
			vector<unique_ptr<ParsedExpression>> children;
			children.push_back(make_uniq<BoundExpression>(make_uniq<BoundReferenceExpression>(name, type, i)));
			children.push_back(make_uniq<ConstantExpression>(formats[LogicalTypeId::DATE]));
			auto func = make_uniq_base<ParsedExpression, FunctionExpression>("strftime", std::move(children));
			unbound_expressions.push_back(std::move(func));
		} else if (has_timestampformat && is_timestamp) {
			// strftime(<name>, 'format')
			vector<unique_ptr<ParsedExpression>> children;
			children.push_back(make_uniq<BoundExpression>(make_uniq<BoundReferenceExpression>(name, type, i)));
			children.push_back(make_uniq<ConstantExpression>(formats[LogicalTypeId::TIMESTAMP]));
			auto func = make_uniq_base<ParsedExpression, FunctionExpression>("strftime", std::move(children));
			unbound_expressions.push_back(std::move(func));
		} else {
			// CAST <name> AS VARCHAR
			auto column = make_uniq<BoundExpression>(make_uniq<BoundReferenceExpression>(name, type, i));
			auto expr = make_uniq_base<ParsedExpression, CastExpression>(LogicalType::VARCHAR, std::move(column));
			unbound_expressions.push_back(std::move(expr));
		}
	}

	// Create an ExpressionBinder, bind the Expressions
	vector<unique_ptr<Expression>> expressions;
	ExpressionBinder expression_binder(*binder, context);
	expression_binder.target_type = LogicalType::VARCHAR;
	for (auto &expr : unbound_expressions) {
		expressions.push_back(expression_binder.Bind(expr));
	}

	return expressions;
}